

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_Iterator::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateDictionaryPeerIterator *pTVar10;
  bool bVar11;
  TemplateDictionaryInterface *pTVar12;
  TemplateString local_2d8;
  TemplateDictionaryPeerIterator *local_2b8;
  Iterator *corn_crop;
  TemplateDictionaryPeerIterator *local_290;
  Iterator *crop;
  TemplateDictionaryPeerIterator *local_268;
  Iterator *flowers;
  TemplateDictionaryPeerIterator *local_240;
  Iterator *ponds;
  TemplateDictionaryPeerIterator *local_218;
  Iterator *barns;
  size_t sStack_208;
  bool local_200;
  undefined7 uStack_1ff;
  TemplateId TStack_1f8;
  TemplateString local_1f0;
  TemplateDictionaryInterface *local_1d0;
  TemplateDictionaryInterface *wheat;
  size_t sStack_1c0;
  bool local_1b8;
  undefined7 uStack_1b7;
  TemplateId TStack_1b0;
  TemplateDictionaryInterface *local_1a8;
  TemplateDictionaryInterface *daisies;
  size_t sStack_198;
  bool local_190;
  undefined7 uStack_18f;
  TemplateId TStack_188;
  TemplateDictionaryInterface *local_180;
  TemplateDictionaryInterface *lilacs;
  size_t sStack_170;
  bool local_168;
  undefined7 uStack_167;
  TemplateId TStack_160;
  TemplateDictionaryInterface *local_158;
  TemplateDictionaryInterface *lillies;
  size_t sStack_148;
  bool local_140;
  undefined7 uStack_13f;
  TemplateId TStack_138;
  TemplateDictionaryInterface *local_130;
  TemplateDictionaryInterface *irrigation_pond;
  size_t sStack_120;
  bool local_118;
  undefined7 uStack_117;
  TemplateId TStack_110;
  TemplateDictionaryInterface *local_108;
  TemplateDictionaryInterface *cattle_pond;
  size_t sStack_f8;
  bool local_f0;
  undefined7 uStack_ef;
  TemplateId TStack_e8;
  TemplateDictionaryInterface *local_e0;
  TemplateDictionaryInterface *duck_pond;
  size_t sStack_d0;
  bool local_c8;
  undefined7 uStack_c7;
  TemplateId TStack_c0;
  TemplateDictionaryInterface *local_b8;
  TemplateDictionaryInterface *grey_barn;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer farm_peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary farm;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&farm_peer,"Farm");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&farm_peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString((TemplateString *)&duck_pond,"BARN");
  TVar1.length_ = sStack_d0;
  TVar1.ptr_ = (char *)duck_pond;
  TVar1.is_immutable_ = local_c8;
  TVar1._17_7_ = uStack_c7;
  TVar1.id_ = TStack_c0;
  local_b8 = (TemplateDictionaryInterface *)
             ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString((TemplateString *)&cattle_pond,"POND");
  TVar2.length_ = sStack_f8;
  TVar2.ptr_ = (char *)cattle_pond;
  TVar2.is_immutable_ = local_f0;
  TVar2._17_7_ = uStack_ef;
  TVar2.id_ = TStack_e8;
  local_e0 = (TemplateDictionaryInterface *)
             ctemplate::TemplateDictionary::AddIncludeDictionary(TVar2);
  ctemplate::TemplateString::TemplateString((TemplateString *)&irrigation_pond,"POND");
  TVar3.length_ = sStack_120;
  TVar3.ptr_ = (char *)irrigation_pond;
  TVar3.is_immutable_ = local_118;
  TVar3._17_7_ = uStack_117;
  TVar3.id_ = TStack_110;
  local_108 = (TemplateDictionaryInterface *)
              ctemplate::TemplateDictionary::AddIncludeDictionary(TVar3);
  ctemplate::TemplateString::TemplateString((TemplateString *)&lillies,"POND");
  TVar4.length_ = sStack_148;
  TVar4.ptr_ = (char *)lillies;
  TVar4.is_immutable_ = local_140;
  TVar4._17_7_ = uStack_13f;
  TVar4.id_ = TStack_138;
  local_130 = (TemplateDictionaryInterface *)
              ctemplate::TemplateDictionary::AddIncludeDictionary(TVar4);
  ctemplate::TemplateString::TemplateString((TemplateString *)&lilacs,"FLOWERS");
  TVar5.length_ = sStack_170;
  TVar5.ptr_ = (char *)lilacs;
  TVar5.is_immutable_ = local_168;
  TVar5._17_7_ = uStack_167;
  TVar5.id_ = TStack_160;
  local_158 = (TemplateDictionaryInterface *)
              ctemplate::TemplateDictionary::AddSectionDictionary(TVar5);
  ctemplate::TemplateString::TemplateString((TemplateString *)&daisies,"FLOWERS");
  TVar6.length_ = sStack_198;
  TVar6.ptr_ = (char *)daisies;
  TVar6.is_immutable_ = local_190;
  TVar6._17_7_ = uStack_18f;
  TVar6.id_ = TStack_188;
  local_180 = (TemplateDictionaryInterface *)
              ctemplate::TemplateDictionary::AddSectionDictionary(TVar6);
  ctemplate::TemplateString::TemplateString((TemplateString *)&wheat,"FLOWERS");
  TVar7.length_ = sStack_1c0;
  TVar7.ptr_ = (char *)wheat;
  TVar7.is_immutable_ = local_1b8;
  TVar7._17_7_ = uStack_1b7;
  TVar7.id_ = TStack_1b0;
  local_1a8 = (TemplateDictionaryInterface *)
              ctemplate::TemplateDictionary::AddSectionDictionary(TVar7);
  ctemplate::TemplateString::TemplateString(&local_1f0,"WHEAT");
  TVar8.length_ = local_1f0.length_;
  TVar8.ptr_ = local_1f0.ptr_;
  TVar8.is_immutable_ = local_1f0.is_immutable_;
  TVar8._17_7_ = local_1f0._17_7_;
  TVar8.id_ = local_1f0.id_;
  local_1d0 = (TemplateDictionaryInterface *)
              ctemplate::TemplateDictionary::AddSectionDictionary(TVar8);
  ctemplate::TemplateString::TemplateString((TemplateString *)&barns,"CORN");
  TVar9.length_ = sStack_208;
  TVar9.ptr_ = (char *)barns;
  TVar9.is_immutable_ = local_200;
  TVar9._17_7_ = uStack_1ff;
  TVar9.id_ = TStack_1f8;
  ctemplate::TemplateDictionary::ShowSection(TVar9);
  ctemplate::TemplateString::TemplateString((TemplateString *)&ponds,"BARN");
  local_218 = ctemplate::TemplateDictionaryPeer::CreateTemplateIterator
                        (&local_a0,(TemplateString *)&ponds);
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_218);
  if (!bVar11) {
    fprintf(_stderr,"Check failed: %s\n","barns->HasNext()");
    exit(1);
  }
  pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_218);
  if (pTVar12 != local_b8) {
    fprintf(_stderr,"Check failed: %s %s %s\n","&barns->Next()","==","grey_barn");
    exit(1);
  }
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_218);
  pTVar10 = local_218;
  if (bVar11) {
    fprintf(_stderr,"Check failed: %s\n","!(barns->HasNext())");
    exit(1);
  }
  if (local_218 != (TemplateDictionaryPeerIterator *)0x0) {
    ctemplate::TemplateDictionaryPeerIterator::~TemplateDictionaryPeerIterator(local_218);
    operator_delete(pTVar10);
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&flowers,"POND");
  local_240 = ctemplate::TemplateDictionaryPeer::CreateTemplateIterator
                        (&local_a0,(TemplateString *)&flowers);
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_240);
  if (!bVar11) {
    fprintf(_stderr,"Check failed: %s\n","ponds->HasNext()");
    exit(1);
  }
  pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_240);
  if (pTVar12 != local_e0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","&ponds->Next()","==","duck_pond");
    exit(1);
  }
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_240);
  if (!bVar11) {
    fprintf(_stderr,"Check failed: %s\n","ponds->HasNext()");
    exit(1);
  }
  pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_240);
  if (pTVar12 != local_108) {
    fprintf(_stderr,"Check failed: %s %s %s\n","&ponds->Next()","==","cattle_pond");
    exit(1);
  }
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_240);
  if (!bVar11) {
    fprintf(_stderr,"Check failed: %s\n","ponds->HasNext()");
    exit(1);
  }
  pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_240);
  if (pTVar12 != local_130) {
    fprintf(_stderr,"Check failed: %s %s %s\n","&ponds->Next()","==","irrigation_pond");
    exit(1);
  }
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_240);
  pTVar10 = local_240;
  if (bVar11) {
    fprintf(_stderr,"Check failed: %s\n","!(ponds->HasNext())");
    exit(1);
  }
  if (local_240 != (TemplateDictionaryPeerIterator *)0x0) {
    ctemplate::TemplateDictionaryPeerIterator::~TemplateDictionaryPeerIterator(local_240);
    operator_delete(pTVar10);
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&crop,"FLOWERS");
  local_268 = ctemplate::TemplateDictionaryPeer::CreateSectionIterator
                        (&local_a0,(TemplateString *)&crop);
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_268);
  if (!bVar11) {
    fprintf(_stderr,"Check failed: %s\n","flowers->HasNext()");
    exit(1);
  }
  pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_268);
  if (pTVar12 != local_158) {
    fprintf(_stderr,"Check failed: %s %s %s\n","&flowers->Next()","==","lillies");
    exit(1);
  }
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_268);
  if (!bVar11) {
    fprintf(_stderr,"Check failed: %s\n","flowers->HasNext()");
    exit(1);
  }
  pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_268);
  if (pTVar12 != local_180) {
    fprintf(_stderr,"Check failed: %s %s %s\n","&flowers->Next()","==","lilacs");
    exit(1);
  }
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_268);
  if (!bVar11) {
    fprintf(_stderr,"Check failed: %s\n","flowers->HasNext()");
    exit(1);
  }
  pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_268);
  if (pTVar12 != local_1a8) {
    fprintf(_stderr,"Check failed: %s %s %s\n","&flowers->Next()","==","daisies");
    exit(1);
  }
  bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_268);
  pTVar10 = local_268;
  if (!bVar11) {
    if (local_268 != (TemplateDictionaryPeerIterator *)0x0) {
      ctemplate::TemplateDictionaryPeerIterator::~TemplateDictionaryPeerIterator(local_268);
      operator_delete(pTVar10);
    }
    ctemplate::TemplateString::TemplateString((TemplateString *)&corn_crop,"WHEAT");
    local_290 = ctemplate::TemplateDictionaryPeer::CreateSectionIterator
                          (&local_a0,(TemplateString *)&corn_crop);
    bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_290);
    if (!bVar11) {
      fprintf(_stderr,"Check failed: %s\n","crop->HasNext()");
      exit(1);
    }
    pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_290);
    if (pTVar12 != local_1d0) {
      fprintf(_stderr,"Check failed: %s %s %s\n","&crop->Next()","==","wheat");
      exit(1);
    }
    bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_290);
    pTVar10 = local_290;
    if (!bVar11) {
      if (local_290 != (TemplateDictionaryPeerIterator *)0x0) {
        ctemplate::TemplateDictionaryPeerIterator::~TemplateDictionaryPeerIterator(local_290);
        operator_delete(pTVar10);
      }
      ctemplate::TemplateString::TemplateString(&local_2d8,"CORN");
      local_2b8 = ctemplate::TemplateDictionaryPeer::CreateSectionIterator(&local_a0,&local_2d8);
      bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_2b8);
      if (!bVar11) {
        fprintf(_stderr,"Check failed: %s\n","corn_crop->HasNext()");
        exit(1);
      }
      pTVar12 = ctemplate::TemplateDictionaryPeerIterator::Next(local_2b8);
      if (pTVar12 == (TemplateDictionaryInterface *)0x0) {
        fprintf(_stderr,"Check failed: %s\n","&corn_crop->Next()");
        exit(1);
      }
      bVar11 = ctemplate::TemplateDictionaryPeerIterator::HasNext(local_2b8);
      pTVar10 = local_2b8;
      if (!bVar11) {
        if (local_2b8 != (TemplateDictionaryPeerIterator *)0x0) {
          ctemplate::TemplateDictionaryPeerIterator::~TemplateDictionaryPeerIterator(local_2b8);
          operator_delete(pTVar10);
        }
        ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
        return;
      }
      fprintf(_stderr,"Check failed: %s\n","!(corn_crop->HasNext())");
      exit(1);
    }
    fprintf(_stderr,"Check failed: %s\n","!(crop->HasNext())");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n","!(flowers->HasNext())");
  exit(1);
}

Assistant:

TEST(TemplateDictionary, Iterator) {
  // Build up a nice community of TemplateDictionaries.
  TemplateDictionary farm("Farm");
  TemplateDictionaryPeer farm_peer(&farm);
  TemplateDictionaryInterface* grey_barn =
      farm.AddIncludeDictionary("BARN");
  TemplateDictionaryInterface* duck_pond =
      farm.AddIncludeDictionary("POND");
  TemplateDictionaryInterface* cattle_pond =
      farm.AddIncludeDictionary("POND");
  TemplateDictionaryInterface* irrigation_pond =
      farm.AddIncludeDictionary("POND");

  // A section name with repeated sections
  TemplateDictionaryInterface* lillies = farm.AddSectionDictionary("FLOWERS");
  TemplateDictionaryInterface* lilacs = farm.AddSectionDictionary("FLOWERS");
  TemplateDictionaryInterface* daisies = farm.AddSectionDictionary("FLOWERS");
  // A section name with one repeat
  TemplateDictionaryInterface* wheat = farm.AddSectionDictionary("WHEAT");
  // A section name, just shown
  farm.ShowSection("CORN");

  // Check that the iterators expose all of the dictionaries.
  TemplateDictionaryPeer::Iterator* barns =
      farm_peer.CreateTemplateIterator("BARN");
  EXPECT_TRUE(barns->HasNext());
  EXPECT_EQ(&barns->Next(), grey_barn);
  EXPECT_FALSE(barns->HasNext());
  delete barns;

  TemplateDictionaryPeer::Iterator* ponds =
      farm_peer.CreateTemplateIterator("POND");
  EXPECT_TRUE(ponds->HasNext());
  EXPECT_EQ(&ponds->Next(), duck_pond);
  EXPECT_TRUE(ponds->HasNext());
  EXPECT_EQ(&ponds->Next(), cattle_pond);
  EXPECT_TRUE(ponds->HasNext());
  EXPECT_EQ(&ponds->Next(), irrigation_pond);
  EXPECT_FALSE(ponds->HasNext());
  delete ponds;

  TemplateDictionaryPeer::Iterator* flowers =
      farm_peer.CreateSectionIterator("FLOWERS");
  EXPECT_TRUE(flowers->HasNext());
  EXPECT_EQ(&flowers->Next(), lillies);
  EXPECT_TRUE(flowers->HasNext());
  EXPECT_EQ(&flowers->Next(), lilacs);
  EXPECT_TRUE(flowers->HasNext());
  EXPECT_EQ(&flowers->Next(), daisies);
  EXPECT_FALSE(flowers->HasNext());
  delete flowers;

  TemplateDictionaryPeer::Iterator* crop =
      farm_peer.CreateSectionIterator("WHEAT");
  EXPECT_TRUE(crop->HasNext());
  EXPECT_EQ(&crop->Next(), wheat);
  EXPECT_FALSE(crop->HasNext());
  delete crop;

  TemplateDictionaryPeer::Iterator* corn_crop =
      farm_peer.CreateSectionIterator("CORN");
  EXPECT_TRUE(corn_crop->HasNext());
  EXPECT_TRUE(&corn_crop->Next());  // ShowSection doesn't give us the dict back
  EXPECT_FALSE(corn_crop->HasNext());
  delete corn_crop;
}